

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::AssertionItemPortSyntax::getChildPtr(AssertionItemPortSyntax *this,size_t index)

{
  undefined8 in_RSI;
  long in_RDI;
  SyntaxNode *in_stack_ffffffffffffffa8;
  PtrTokenOrSyntax *in_stack_ffffffffffffffb0;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8)
    ;
    break;
  case 2:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8)
    ;
    break;
  case 3:
    not_null<slang::syntax::DataTypeSyntax_*>::get
              ((not_null<slang::syntax::DataTypeSyntax_*> *)(in_RDI + 0x70));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  case 4:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,(Token *)in_stack_ffffffffffffffa8)
    ;
    break;
  case 5:
    PtrTokenOrSyntax::PtrTokenOrSyntax
              ((PtrTokenOrSyntax *)(in_RDI + 0x88),in_stack_ffffffffffffffa8);
    break;
  case 6:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax AssertionItemPortSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &local;
        case 2: return &direction;
        case 3: return type.get();
        case 4: return &name;
        case 5: return &dimensions;
        case 6: return defaultValue;
        default: return nullptr;
    }
}